

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O3

_Bool bitset_for_each(bitset_t *b,bitset_iterator iterator,void *ptr)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (b->arraysize != 0) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar3 = b->array[uVar4];
      while (uVar3 != 0) {
        uVar1 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        _Var2 = (*iterator)(uVar1 | uVar5,ptr);
        uVar3 = uVar3 & uVar3 - 1;
        if (!_Var2) {
          return false;
        }
      }
      uVar5 = uVar5 + 0x40;
      uVar4 = uVar4 + 1;
    } while (uVar4 < b->arraysize);
  }
  return true;
}

Assistant:

inline bool bitset_for_each(const bitset_t *b, bitset_iterator iterator, void *ptr) {
  size_t base = 0;
  for (size_t i = 0; i < b->arraysize; ++i ) {
    uint64_t w = b->array[i];
    while (w != 0) {
      uint64_t t = w & (~w + 1);
      int r = cbitset_trailing_zeroes(w);
      if(!iterator(r + base, ptr)) return false;
      w ^= t;
    }
    base += 64;
  }
  return true;
}